

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,PreOrPostIncOrDec *p)

{
  FunctionBuilder *this_00;
  Context *args;
  bool bVar1;
  Allocator *this_01;
  int iVar2;
  undefined4 extraout_var;
  Variable *dest;
  Constant *rhs;
  Variable *source;
  Variable *pVVar3;
  Variable *local_108;
  pool_ptr<soul::heart::Variable> resultDestVar;
  CodeLocation local_f0;
  Type local_e0;
  Type type;
  Value local_b0;
  Value local_70;
  
  pVVar3 = (this->currentTargetVariable).object;
  bVar1 = p->isIncrement;
  resultDestVar.object = pVVar3;
  local_108 = (Variable *)getAsReference(this,(p->target).object,false);
  iVar2 = (*(local_108->super_Expression).super_Object._vptr_Object[2])();
  Type::removeReferenceIfPresent(&type,(Type *)CONCAT44(extraout_var,iVar2));
  this_00 = &this->builder;
  local_e0.category = type.category;
  local_e0.arrayElementCategory = type.arrayElementCategory;
  local_e0.isRef = type.isRef;
  local_e0.isConstant = type.isConstant;
  local_e0.primitiveType.type = type.primitiveType.type;
  local_e0.boundingSize = type.boundingSize;
  local_e0.arrayElementBoundingSize = type.arrayElementBoundingSize;
  local_e0.structure.object = type.structure.object;
  if (type.structure.object != (Structure *)0x0) {
    ((type.structure.object)->super_RefCountedObject).refCount =
         ((type.structure.object)->super_RefCountedObject).refCount + 1;
  }
  dest = BlockBuilder::createRegisterVariable(&this_00->super_BlockBuilder,&local_e0);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_e0.structure);
  BlockBuilder::addAssignment
            (&this_00->super_BlockBuilder,&dest->super_Expression,(Expression *)local_108);
  this_01 = this->module->allocator;
  soul::Value::Value(&local_b0,1);
  soul::Value::castToTypeExpectingSuccess(&local_70,&local_b0,&type);
  args = &(p->super_Expression).super_Statement.super_ASTObject.context;
  rhs = PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value>
                  (&this_01->pool,&args->location,&local_70);
  soul::Value::~Value(&local_70);
  soul::Value::~Value(&local_b0);
  local_f0.sourceCode.object = (args->location).sourceCode.object;
  if (local_f0.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_f0.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_f0.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_f0.location.data =
       (p->super_Expression).super_Statement.super_ASTObject.context.location.location.data;
  source = (Variable *)
           BlockBuilder::createBinaryOp
                     (&this_00->super_BlockBuilder,&local_f0,&dest->super_Expression,
                      &rhs->super_Expression,bVar1 ^ subtract);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_f0.sourceCode);
  if (pVVar3 != (Variable *)0x0) {
    if (p->isPost == true) {
      BlockBuilder::addAssignment
                (&this_00->super_BlockBuilder,(Expression *)local_108,(Expression *)source);
      local_108 = pool_ptr<soul::heart::Variable>::operator*(&resultDestVar);
      source = dest;
    }
    else {
      pVVar3 = pool_ptr<soul::heart::Variable>::operator*(&resultDestVar);
      BlockBuilder::addAssignment
                (&this_00->super_BlockBuilder,&pVVar3->super_Expression,(Expression *)source);
      source = pool_ptr<soul::heart::Variable>::operator*(&resultDestVar);
    }
  }
  BlockBuilder::addAssignment
            (&this_00->super_BlockBuilder,&local_108->super_Expression,&source->super_Expression);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&type.structure);
  return;
}

Assistant:

void visit (AST::PreOrPostIncOrDec& p) override
    {
        auto resultDestVar = currentTargetVariable;
        auto op = p.isIncrement ? BinaryOp::Op::add
                                : BinaryOp::Op::subtract;

        auto& dest = getAsReference (p.target, false);
        auto type = dest.getType().removeReferenceIfPresent();

        auto& oldValue = builder.createRegisterVariable (type);
        builder.addAssignment (oldValue, dest);
        auto& one = module.allocator.allocate<heart::Constant> (p.context.location, Value::createInt32 (1).castToTypeExpectingSuccess (type));
        auto& incrementedValue = builder.createBinaryOp (p.context.location, oldValue, one, op);

        if (resultDestVar == nullptr)
        {
            builder.addAssignment (dest, incrementedValue);
        }
        else if (p.isPost)
        {
            builder.addAssignment (dest, incrementedValue);
            builder.addAssignment (*resultDestVar, oldValue);
        }
        else
        {
            builder.addAssignment (*resultDestVar, incrementedValue);
            builder.addAssignment (dest, *resultDestVar);
        }
    }